

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

int Cudd_zddPrintMinterm(DdManager *zdd,DdNode *node)

{
  uint uVar1;
  int iVar2;
  int *list;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = zdd->sizeZ;
  list = (int *)malloc((long)(int)uVar1 * 4);
  if (list == (int *)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      list[uVar3] = 3;
    }
    zdd_print_minterm_aux(zdd,node,0,list);
    free(list);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_zddPrintMinterm(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zdd_print_minterm_aux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}